

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# entities.c
# Opt level: O0

Bool prvTidyEntityInfo(ctmbstr name,Bool isXml,uint *code,uint *versions)

{
  entity *peVar1;
  undefined4 uVar2;
  uint local_40;
  int local_3c;
  uint c;
  int res;
  entity *np;
  uint *versions_local;
  uint *code_local;
  ctmbstr ptStack_18;
  Bool isXml_local;
  ctmbstr name_local;
  
  np = (entity *)versions;
  versions_local = code;
  code_local._4_4_ = isXml;
  ptStack_18 = name;
  if ((name == (ctmbstr)0x0) || (*name != '&')) {
    __assert_fail("name && name[0] == \'&\'",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/geoffmcl[P]tidy-fork/src/entities.c"
                  ,0x846,"Bool prvTidyEntityInfo(ctmbstr, Bool, uint *, uint *)");
  }
  if (code == (uint *)0x0) {
    __assert_fail("code != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/geoffmcl[P]tidy-fork/src/entities.c"
                  ,0x847,"Bool prvTidyEntityInfo(ctmbstr, Bool, uint *, uint *)");
  }
  if (versions != (uint *)0x0) {
    if (name[1] == '#') {
      local_40 = 0;
      if ((name[2] == 'x') || ((isXml == no && (name[2] == 'X')))) {
        local_3c = __isoc99_sscanf(name + 3,"%x",&local_40);
      }
      else {
        local_3c = __isoc99_sscanf(name + 2,"%u",&local_40);
      }
      if (local_3c == 1) {
        *versions_local = local_40;
        *(undefined4 *)&np->name = 0x61fff;
        name_local._4_4_ = yes;
      }
      else {
        *versions_local = 0;
        uVar2 = 0xe000;
        if (code_local._4_4_ != no) {
          uVar2 = 0x10000;
        }
        *(undefined4 *)&np->name = uVar2;
        name_local._4_4_ = no;
      }
    }
    else {
      peVar1 = entitiesLookup(name + 1);
      if (peVar1 == (entity *)0x0) {
        *versions_local = 0;
        uVar2 = 0xe000;
        if (code_local._4_4_ != no) {
          uVar2 = 0x10000;
        }
        *(undefined4 *)&np->name = uVar2;
        name_local._4_4_ = no;
      }
      else {
        *versions_local = peVar1->code;
        *(uint *)&np->name = peVar1->versions;
        name_local._4_4_ = yes;
      }
    }
    return name_local._4_4_;
  }
  __assert_fail("versions != NULL",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/geoffmcl[P]tidy-fork/src/entities.c"
                ,0x848,"Bool prvTidyEntityInfo(ctmbstr, Bool, uint *, uint *)");
}

Assistant:

Bool TY_(EntityInfo)( ctmbstr name, Bool isXml, uint* code, uint* versions )
{
    const entity* np;
    int res;
    assert( name && name[0] == '&' );
    assert( code != NULL );
    assert( versions != NULL );

    /* numeric entitity: name = "&#" followed by number */
    if ( name[1] == '#' )
    {
        uint c = 0;  /* zero on missing/bad number */

        /* 'x' prefix denotes hexadecimal number format */
        if ( name[2] == 'x' || (!isXml && name[2] == 'X') )
            res = sscanf( name+3, "%x", &c );
        else
            res = sscanf( name+2, "%u", &c );

        /*  Issue #373 - Null Char in XML result doc - sf905 2009 */
        if ( res == 1 )
        {
            *code = c;
            *versions = VERS_ALL;
            return yes;
        }
        else
        {
            *code = 0;
            *versions = ( isXml ? VERS_XML : VERS_PROPRIETARY );
            return no;
        }
    }

    /* Named entity: name ="&" followed by a name */
    if ( NULL != (np = entitiesLookup(name+1)) )
    {
        *code = np->code;
        *versions = np->versions;
        return yes;
    }

    *code = 0;
    *versions = ( isXml ? VERS_XML : VERS_PROPRIETARY );
    return no;
}